

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void try_call(ch_context *context,ch_primitive primitive,ch_argcount argcount)

{
  anon_union_8_4_dd993ae3_for_ch_primitive_1 function;
  char *error;
  ch_primitive_type cVar1;
  ch_closure *closure;
  
  function = primitive.field_1;
  cVar1 = primitive.type;
  if (cVar1 == PRIMITIVE_OBJECT) {
    cVar1 = ((ch_object *)&(function.object_value)->type)->type;
    if (cVar1 == PRIMITIVE_NUMBER) {
      call(context,(ch_function *)function.object_value,argcount);
      return;
    }
    if (cVar1 == PRIMITIVE_OBJECT) {
      (*(code *)*(ch_function **)(function.object_value + 2))(context,argcount);
      return;
    }
    if (cVar1 == PRIMITIVE_BOOLEAN) {
      call(context,*(ch_function **)(function.object_value + 2),argcount);
      (context->call_stack).calls[(context->call_stack).size - 1].closure = (ch_closure *)function;
      return;
    }
    error = "Attempted to invoke object type %d as a function.";
  }
  else {
    error = "Attempted to invoke type %d as a function.";
  }
  ch_runtime_error(context,EXIT_INCORRECT_TYPE,error,(ulong)cVar1);
  return;
}

Assistant:

static void try_call(ch_context *context, ch_primitive primitive,
                     ch_argcount argcount) {
  if (!IS_OBJECT(primitive)) {
    ch_runtime_error(context, EXIT_INCORRECT_TYPE,
                     "Attempted to invoke type %d as a function.",
                     primitive.type);
    return;
  }

  ch_object *object = AS_OBJECT(primitive);

  if (IS_CLOSURE(object)) {
    ch_closure* closure = AS_CLOSURE(object);
    call(context, closure->function, argcount);
    CURRENT_CALL(context).closure = closure;
    return;
  }

  if (IS_FUNCTION(object)) {
    call(context, AS_FUNCTION(object), argcount);
    return;
  }

  if (IS_NATIVE(object)) {
    ch_native *native = AS_NATIVE(object);
    native->function(context, argcount);
    return;
  }

  ch_runtime_error(context, EXIT_INCORRECT_TYPE,
                   "Attempted to invoke object type %d as a function.",
                   object->type);
}